

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bninchrr(const_bstring b0,int pos,const_bstring b1)

{
  byte bVar1;
  int iVar2;
  uchar *puVar3;
  bool bVar4;
  int i;
  int iVar5;
  long lVar6;
  uint uVar7;
  charField chrs;
  charField local_40;
  
  if ((((b0 != (const_bstring)0x0 && -1 < pos) && (puVar3 = b0->data, puVar3 != (uchar *)0x0)) &&
      (iVar2 = b0->slen, pos <= iVar2)) && (iVar5 = buildCharField(&local_40,b1), -1 < iVar5)) {
    uVar7 = pos - (uint)(iVar2 == pos);
    lVar6 = 0;
    do {
      local_40.content[lVar6] = ~local_40.content[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x20);
    if (-1 < (int)uVar7) {
      do {
        bVar1 = puVar3[uVar7];
        if ((local_40.content[bVar1 >> 3] >> (bVar1 & 7) & 1) != 0) {
          return uVar7;
        }
        bVar4 = 0 < (int)uVar7;
        uVar7 = uVar7 - 1;
      } while (bVar4);
    }
  }
  return -1;
}

Assistant:

int bninchrr (const_bstring b0, int pos, const_bstring b1) {
struct charField chrs;
	if (pos < 0 || b0 == NULL || b0->data == NULL ||
	    b0->slen < pos) return BSTR_ERR;
	if (pos == b0->slen) pos--;
	if (buildCharField (&chrs, b1) < 0) return BSTR_ERR;
	invertCharField (&chrs);
	return binchrrCF (b0->data, pos, &chrs);
}